

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

int check_stored_host_key(char *hostname,int port,char *keytype,char *key)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_t sVar3;
  char *pcVar4;
  char porttext [20];
  char local_48 [24];
  
  iVar1 = 1;
  pcVar2 = make_filename(1,(char *)0x0);
  __stream = fopen(pcVar2,"r");
  safefree(pcVar2);
  if (__stream != (FILE *)0x0) {
    pcVar2 = fgetline((FILE *)__stream);
    iVar1 = 1;
    if (pcVar2 != (char *)0x0) {
      do {
        sVar3 = strcspn(pcVar2,"\n");
        pcVar2[sVar3] = '\0';
        sVar3 = strlen(keytype);
        sVar3 = (size_t)(int)sVar3;
        iVar1 = strncmp(pcVar2,keytype,sVar3);
        if ((iVar1 == 0) && (pcVar2[sVar3] == '@')) {
          pcVar4 = pcVar2 + sVar3 + 1;
          sprintf(local_48,"%d",(ulong)(uint)port);
          sVar3 = strlen(local_48);
          sVar3 = (size_t)(int)sVar3;
          iVar1 = strncmp(pcVar4,local_48,sVar3);
          if ((iVar1 == 0) && (pcVar4[sVar3] == ':')) {
            pcVar4 = pcVar4 + sVar3 + 1;
            sVar3 = strlen(hostname);
            sVar3 = (size_t)(int)sVar3;
            iVar1 = strncmp(pcVar4,hostname,sVar3);
            if ((iVar1 == 0) && (pcVar4[sVar3] == ' ')) {
              iVar1 = strcmp(pcVar4 + sVar3 + 1,key);
              iVar1 = (uint)(iVar1 != 0) * 2;
              safefree(pcVar2);
              goto LAB_00117804;
            }
          }
        }
        safefree(pcVar2);
        pcVar2 = fgetline((FILE *)__stream);
      } while (pcVar2 != (char *)0x0);
      iVar1 = 1;
    }
LAB_00117804:
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int check_stored_host_key(const char *hostname, int port,
                          const char *keytype, const char *key)
{
    FILE *fp;
    char *filename;
    char *line;
    int ret;

    filename = make_filename(INDEX_HOSTKEYS, NULL);
    fp = fopen(filename, "r");
    sfree(filename);
    if (!fp)
        return 1;                      /* key does not exist */

    ret = 1;
    while ( (line = fgetline(fp)) ) {
        int i;
        char *p = line;
        char porttext[20];

        line[strcspn(line, "\n")] = '\0';   /* strip trailing newline */

        i = strlen(keytype);
        if (strncmp(p, keytype, i))
            goto done;
        p += i;

        if (*p != '@')
            goto done;
        p++;

        sprintf(porttext, "%d", port);
        i = strlen(porttext);
        if (strncmp(p, porttext, i))
            goto done;
        p += i;

        if (*p != ':')
            goto done;
        p++;

        i = strlen(hostname);
        if (strncmp(p, hostname, i))
            goto done;
        p += i;

        if (*p != ' ')
            goto done;
        p++;

        /*
         * Found the key. Now just work out whether it's the right
         * one or not.
         */
        if (!strcmp(p, key))
            ret = 0;                   /* key matched OK */
        else
            ret = 2;                   /* key mismatch */

        done:
        sfree(line);
        if (ret != 1)
            break;
    }

    fclose(fp);
    return ret;
}